

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O2

void __thiscall
duckdb::DataTable::RemoveFromIndexes
          (DataTable *this,TableAppendState *state,DataChunk *chunk,row_t row_start)

{
  bool bVar1;
  DataTableInfo *pDVar2;
  TableAppendState *state_00;
  LogicalType local_a0;
  Vector row_identifiers;
  
  pDVar2 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&this->info);
  bVar1 = TableIndexList::Empty(&pDVar2->indexes);
  if (!bVar1) {
    LogicalType::LogicalType(&local_a0,BIGINT);
    Vector::Vector(&row_identifiers,&local_a0,0x800);
    LogicalType::~LogicalType(&local_a0);
    state_00 = (TableAppendState *)chunk->count;
    VectorOperations::GenerateSequence(&row_identifiers,(idx_t)state_00,row_start,1);
    RemoveFromIndexes(this,state_00,chunk,&row_identifiers);
    Vector::~Vector(&row_identifiers);
  }
  return;
}

Assistant:

void DataTable::RemoveFromIndexes(TableAppendState &state, DataChunk &chunk, row_t row_start) {
	D_ASSERT(IsMainTable());
	if (info->indexes.Empty()) {
		return;
	}
	// first generate the vector of row identifiers
	Vector row_identifiers(LogicalType::ROW_TYPE);
	VectorOperations::GenerateSequence(row_identifiers, chunk.size(), row_start, 1);

	// now remove the entries from the indices
	RemoveFromIndexes(state, chunk, row_identifiers);
}